

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O3

void __thiscall
btHashMap<btHashPtr,_btCollisionShape_*>::insert
          (btHashMap<btHashPtr,_btCollisionShape_*> *this,btHashPtr *key,btCollisionShape **value)

{
  uint uVar1;
  btCollisionShape **ptr;
  btHashPtr *ptr_00;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  btCollisionShape **ppbVar6;
  btHashPtr *pbVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  iVar5 = (key->field_0).m_hashValues[0];
  iVar9 = (key->field_0).m_hashValues[1];
  iVar11 = (this->m_valueArray).m_capacity;
  iVar3 = findIndex(this,key);
  if (iVar3 == -1) {
    uVar1 = (this->m_valueArray).m_size;
    uVar8 = (this->m_valueArray).m_capacity;
    uVar4 = uVar1;
    if (uVar1 == uVar8) {
      iVar3 = 1;
      if (uVar1 != 0) {
        iVar3 = uVar1 * 2;
      }
      if ((int)uVar1 < iVar3) {
        if (iVar3 == 0) {
          ppbVar6 = (btCollisionShape **)0x0;
        }
        else {
          ppbVar6 = (btCollisionShape **)btAlignedAllocInternal((long)iVar3 << 3,0x10);
          uVar4 = (this->m_valueArray).m_size;
        }
        if (0 < (int)uVar4) {
          uVar10 = 0;
          do {
            ppbVar6[uVar10] = (this->m_valueArray).m_data[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
        }
        ptr = (this->m_valueArray).m_data;
        if ((ptr != (btCollisionShape **)0x0) && ((this->m_valueArray).m_ownsMemory == true)) {
          btAlignedFreeInternal(ptr);
          uVar4 = (this->m_valueArray).m_size;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = ppbVar6;
        (this->m_valueArray).m_capacity = iVar3;
      }
    }
    (this->m_valueArray).m_data[(int)uVar4] = *value;
    (this->m_valueArray).m_size = uVar4 + 1;
    uVar4 = (this->m_keyArray).m_size;
    if (uVar4 == (this->m_keyArray).m_capacity) {
      iVar3 = 1;
      if (uVar4 != 0) {
        iVar3 = uVar4 * 2;
      }
      if ((int)uVar4 < iVar3) {
        if (iVar3 == 0) {
          pbVar7 = (btHashPtr *)0x0;
        }
        else {
          pbVar7 = (btHashPtr *)btAlignedAllocInternal((long)iVar3 << 3,0x10);
          uVar4 = (this->m_keyArray).m_size;
        }
        if (0 < (int)uVar4) {
          uVar10 = 0;
          do {
            pbVar7[uVar10].field_0 = (this->m_keyArray).m_data[uVar10].field_0;
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
        }
        ptr_00 = (this->m_keyArray).m_data;
        if ((ptr_00 != (btHashPtr *)0x0) && ((this->m_keyArray).m_ownsMemory == true)) {
          btAlignedFreeInternal(ptr_00);
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pbVar7;
        (this->m_keyArray).m_capacity = iVar3;
        uVar4 = (this->m_keyArray).m_size;
      }
    }
    (this->m_keyArray).m_data[(int)uVar4].field_0 = key->field_0;
    piVar2 = &(this->m_keyArray).m_size;
    *piVar2 = *piVar2 + 1;
    if ((int)uVar8 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      iVar5 = (key->field_0).m_hashValues[1] + (key->field_0).m_hashValues[0];
      uVar8 = ~(iVar5 * 0x8000) + iVar5;
      uVar8 = ((int)uVar8 >> 10 ^ uVar8) * 9;
      uVar8 = (int)uVar8 >> 6 ^ uVar8;
      uVar8 = ~(uVar8 << 0xb) + uVar8;
      uVar8 = (int)uVar8 >> 0x10 ^ uVar8;
      iVar11 = (this->m_valueArray).m_capacity;
    }
    else {
      iVar9 = iVar9 + iVar5;
      uVar8 = ~(iVar9 * 0x8000) + iVar9;
      uVar8 = ((int)uVar8 >> 10 ^ uVar8) * 9;
      uVar8 = (int)uVar8 >> 6 ^ uVar8;
      uVar8 = ~(uVar8 << 0xb) + uVar8;
      uVar8 = (int)uVar8 >> 0x10 ^ uVar8;
    }
    uVar8 = iVar11 - 1U & uVar8;
    piVar2 = (this->m_hashTable).m_data;
    (this->m_next).m_data[(int)uVar1] = piVar2[(int)uVar8];
    piVar2[(int)uVar8] = uVar1;
  }
  else {
    (this->m_valueArray).m_data[iVar3] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}